

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O0

string * __thiscall
interval::str_abi_cxx11_(string *__return_storage_ptr__,interval *this,Interval i)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  undefined1 local_60 [8];
  string s;
  undefined1 local_38 [8];
  string f;
  Interval i_local;
  
  s.field_2._8_8_ = this;
  f.field_2._8_8_ = this;
  iVar1 = lower((Interval)this);
  istr_abi_cxx11_((string *)local_38,iVar1);
  local_68 = f.field_2._8_8_;
  iVar1 = upper((Interval)f.field_2._8_8_);
  istr_abi_cxx11_((string *)local_60,iVar1);
  std::operator+(&local_c8,"[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_a8,&local_c8,",");
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(__return_storage_ptr__,&local_88,"]");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string interval::str(Interval i) {
  std::string f = istr(lower(i));
  std::string s = istr(upper(i));
  return "[" + f + "," + s + "]";
}